

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void testing::internal::ReportFailureInUnknownLocation(Type result_type,string *message)

{
  allocator local_39;
  string local_38;
  
  UnitTest::GetInstance();
  std::__cxx11::string::string((string *)&local_38,"",&local_39);
  UnitTest::AddTestPartResult
            (&UnitTest::GetInstance::instance,result_type,(char *)0x0,-1,message,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void ReportFailureInUnknownLocation(TestPartResult::Type result_type,
                                    const std::string& message) {
  // This function is a friend of UnitTest and as such has access to
  // AddTestPartResult.
  UnitTest::GetInstance()->AddTestPartResult(
      result_type,
      NULL,  // No info about the source file where the exception occurred.
      -1,    // We have no info on which line caused the exception.
      message,
      "");   // No stack trace, either.
}